

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O2

void __thiscall btSimpleDynamicsWorld::clearForces(btSimpleDynamicsWorld *this)

{
  btCollisionObject *pbVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0;
      lVar2 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
      lVar2 = lVar2 + 1) {
    pbVar1 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data[lVar2];
    if ((pbVar1 != (btCollisionObject *)0x0) && ((pbVar1->m_internalType & 2U) != 0)) {
      pbVar1[1].m_interpolationAngularVelocity.m_floats[2] = 0.0;
      pbVar1[1].m_interpolationAngularVelocity.m_floats[3] = 0.0;
      pbVar1[1].m_anisotropicFriction.m_floats[0] = 0.0;
      pbVar1[1].m_anisotropicFriction.m_floats[1] = 0.0;
      pbVar1[1].m_interpolationLinearVelocity.m_floats[2] = 0.0;
      pbVar1[1].m_interpolationLinearVelocity.m_floats[3] = 0.0;
      pbVar1[1].m_interpolationAngularVelocity.m_floats[0] = 0.0;
      pbVar1[1].m_interpolationAngularVelocity.m_floats[1] = 0.0;
    }
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::clearForces()
{
	///@todo: iterate over awake simulation islands!
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			body->clearForces();
		}
	}
}